

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseStringLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   *this,UnicodeChar quoteChar)

{
  UTF8Reader *this_00;
  string *target;
  UnicodeChar charToWrite;
  UnicodeChar UVar1;
  uint uVar2;
  int iVar3;
  CompileMessage local_68;
  
  if ((quoteChar == 0x27) || (quoteChar == 0x22)) {
    this_00 = &this->input;
    UTF8Reader::operator++(this_00);
    target = &this->currentStringValue;
    std::__cxx11::string::_M_replace
              ((ulong)target,0,(char *)(this->currentStringValue)._M_string_length,0);
    charToWrite = UTF8Reader::getAndAdvance(this_00);
    while (charToWrite != quoteChar) {
      if (charToWrite != 0x5c) goto switchD_001cd200_caseD_6f;
      charToWrite = UTF8Reader::getAndAdvance(this_00);
      if ((int)charToWrite < 0x6e) {
        if (charToWrite == 0x61) {
          charToWrite = 7;
        }
        else if (charToWrite == 0x62) {
          charToWrite = 8;
        }
        else {
          if (charToWrite != 0x66) goto switchD_001cd200_caseD_6f;
          charToWrite = 0xc;
        }
        goto LAB_001cd2e8;
      }
      switch(charToWrite) {
      case 0x6e:
        charToWrite = 10;
        break;
      default:
        goto switchD_001cd200_caseD_6f;
      case 0x72:
        charToWrite = 0xd;
        break;
      case 0x74:
        charToWrite = 9;
        break;
      case 0x75:
        charToWrite = 0;
        iVar3 = -4;
        do {
          UVar1 = UTF8Reader::getAndAdvance(this_00);
          uVar2 = UVar1 - 0x30;
          if (9 < uVar2) {
            if (UVar1 - 0x61 < 6) {
              uVar2 = UVar1 - 0x57;
            }
            else if (UVar1 - 0x41 < 6) {
              uVar2 = UVar1 - 0x37;
            }
            else {
              (this->location).location.data = (this->input).data;
              CompileMessageHelpers::createMessage<>
                        (&local_68,syntax,error,"Syntax error in unicode escape sequence");
              (*this->_vptr_Tokeniser[2])(this,&local_68);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
                operator_delete(local_68.description._M_dataplus._M_p,
                                local_68.description.field_2._M_allocated_capacity + 1);
              }
              uVar2 = 0xffffffff;
            }
          }
          charToWrite = charToWrite * 0x10 + uVar2;
          iVar3 = iVar3 + 1;
        } while (iVar3 != 0);
switchD_001cd200_caseD_6f:
        if (charToWrite != 0) break;
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,"Unexpected end-of-input in string constant");
        (*this->_vptr_Tokeniser[2])(this,&local_68);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
          operator_delete(local_68.description._M_dataplus._M_p,
                          local_68.description.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::push_back((char)target);
        goto LAB_001cd351;
      }
LAB_001cd2e8:
      appendUTF8(target,charToWrite);
LAB_001cd351:
      charToWrite = UTF8Reader::getAndAdvance(this_00);
    }
    checkCharacterImmediatelyAfterLiteral(this);
  }
  return quoteChar == 0x27 || quoteChar == 0x22;
}

Assistant:

bool parseStringLiteral (UnicodeChar quoteChar)
    {
        if (quoteChar != '"' && quoteChar != '\'')
            return false;

        ++input;
        currentStringValue = {};

        for (;;)
        {
            auto c = input.getAndAdvance();

            if (c == quoteChar)
                break;

            if (c == '\\')
            {
                c = input.getAndAdvance();

                switch (c)
                {
                    case '"':
                    case '\'':
                    case '\\':
                    case '/':  break;

                    case 'a':  c = '\a'; break;
                    case 'b':  c = '\b'; break;
                    case 'f':  c = '\f'; break;
                    case 'n':  c = '\n'; break;
                    case 'r':  c = '\r'; break;
                    case 't':  c = '\t'; break;

                    case 'u':
                    {
                        c = 0;

                        for (int i = 4; --i >= 0;)
                        {
                            auto digitValue = choc::text::hexDigitToInt (input.getAndAdvance());

                            if (digitValue < 0)
                            {
                                location.location = input;
                                throwError (Errors::errorInEscapeCode());
                            }

                            c = (UnicodeChar) ((c << 4) + static_cast<UnicodeChar> (digitValue));
                        }

                        break;
                    }
                }
            }

            if (c == 0)
                throwError (Errors::endOfInputInStringConstant());

            appendUTF8 (currentStringValue, c);
        }

        checkCharacterImmediatelyAfterLiteral();
        return true;
    }